

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__list
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  ParserChar *text;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  uint *puVar6;
  StringHash SVar7;
  void *pvVar8;
  uint uVar9;
  long lVar10;
  xmlChar **ppxVar11;
  bool failed_1;
  ParserChar *attributeValue;
  bool failed;
  bool local_139;
  ParserChar *local_138;
  StackMemoryManager *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  uint *local_120;
  URI local_118;
  
  local_130 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
  puVar6 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x128);
  uVar1 = list__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar6 = list__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar6 + 2) = uVar1;
  uVar1 = list__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar6 + 4) = list__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar6 + 6) = uVar1;
  uVar1 = list__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar6 + 8) = list__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar6 + 10) = uVar1;
  this_00 = (URI *)(puVar6 + 0xc);
  COLLADABU::URI::URI(this_00,(URI *)(list__AttributeData::DEFAULT + 0x30),false);
  uVar4 = list__AttributeData::DEFAULT._292_4_;
  uVar3 = list__AttributeData::DEFAULT._288_4_;
  uVar2 = list__AttributeData::DEFAULT._284_4_;
  puVar6[0x46] = list__AttributeData::DEFAULT._280_4_;
  puVar6[0x47] = uVar2;
  puVar6[0x48] = uVar3;
  puVar6[0x49] = uVar4;
  *attributeDataPtr = puVar6;
  ppxVar11 = attributes->attributes;
  if (ppxVar11 != (xmlChar **)0x0) {
    local_120 = puVar6 + 0x46;
    local_128 = (XSList<GeneratedSaxParser::ParserString> *)(puVar6 + 2);
    do {
      text = *ppxVar11;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar7 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_138 = ppxVar11[1];
        if ((long)SVar7 < 0x6a28a3) {
          if (SVar7 == 0x6f4) {
            *(ParserChar **)(puVar6 + 10) = local_138;
          }
          else if (SVar7 == 0x6f8b6) {
            GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
            COLLADABU::URI::operator=(this_00,&local_118);
            COLLADABU::URI::~URI(&local_118);
            if ((local_139 == true) &&
               (bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x730a4,0x6f8b6,local_138), bVar5)
               ) {
LAB_0075cb7a:
              bVar5 = false;
              validationDataPtr = (void **)0x1;
            }
            else {
              validationDataPtr = (void **)0x4;
              bVar5 = true;
              if (local_139 == false) {
                *(byte *)puVar6 = (byte)*puVar6 | 2;
              }
            }
LAB_0075cb9d:
            if (!bVar5) goto LAB_0075cc12;
          }
          else if (SVar7 == 0x7f8b6) {
            *(ParserChar **)(puVar6 + 8) = local_138;
          }
          else {
LAB_0075cb01:
            if (*(long *)local_120 == 0) {
              pvVar8 = GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x10);
            }
            else {
              pvVar8 = GeneratedSaxParser::StackMemoryManager::growObject(local_130,0x10);
            }
            *(void **)(puVar6 + 0x46) = pvVar8;
            lVar10 = *(long *)(puVar6 + 0x48);
            *(ParserChar **)((long)pvVar8 + lVar10 * 8) = text;
            *(ParserChar **)(*(long *)(puVar6 + 0x46) + 8 + lVar10 * 8) = local_138;
            *(long *)(puVar6 + 0x48) = lVar10 + 2;
          }
LAB_0075cc10:
          validationDataPtr = (void **)0x0;
        }
        else {
          if (SVar7 != 0x6a28a3) {
            if (SVar7 != 0x7ac025) {
              if (SVar7 != 0x768ac2) goto LAB_0075cb01;
              SVar7 = GeneratedSaxParser::Utils::calculateStringHash(local_138,(bool *)&local_118);
              lVar10 = 0;
              bVar5 = false;
              do {
                if (*(StringHash *)((long)&ENUM__mathml__list__orderMap + lVar10) == SVar7) {
                  local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                  validationDataPtr = (void **)(ulong)*(uint *)((long)&DAT_0085b488 + lVar10);
                }
                uVar9 = (uint)validationDataPtr;
                if (*(StringHash *)((long)&ENUM__mathml__list__orderMap + lVar10) == SVar7) break;
                lVar10 = lVar10 + 0x10;
                bVar5 = lVar10 != 0x10;
              } while (lVar10 == 0x10);
              if (bVar5) {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
                uVar9 = 2;
              }
              puVar6[1] = uVar9;
              if (((char)local_118.mUriString._M_dataplus._M_p == '\x01') &&
                 (bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                     ERROR_ATTRIBUTE_PARSING_FAILED,0x730a4,0x768ac2,local_138),
                 bVar5)) goto LAB_0075cb7a;
              validationDataPtr = (void **)0x4;
              bVar5 = true;
              goto LAB_0075cb9d;
            }
            *(ParserChar **)(puVar6 + 6) = local_138;
            goto LAB_0075cc10;
          }
          bVar5 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                  ::
                  characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                            (&this->
                              super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                             ,local_138,local_128);
          if (bVar5) {
            *(byte *)puVar6 = (byte)*puVar6 | 1;
            validationDataPtr = (void **)0x4;
            bVar5 = true;
          }
          else {
            bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x730a4,0x6a28a3,local_138);
            bVar5 = !bVar5;
            validationDataPtr = (void **)(ulong)((uint)bVar5 + (uint)bVar5 * 2 + 1);
          }
          if (bVar5) goto LAB_0075cc10;
        }
LAB_0075cc12:
        ppxVar11 = ppxVar11 + 2;
      }
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*puVar6 & 1) == 0) {
    puVar6[2] = 0;
    puVar6[3] = 0;
    puVar6[4] = 0;
    puVar6[5] = 0;
  }
  if ((*puVar6 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__list( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__list( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

list__AttributeData* attributeData = newData<list__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ORDER:
    {
bool failed;
attributeData->order = Utils::toEnum<ENUM__mathml__list__order, StringHash, ENUM__mathml__list__order__COUNT>(attributeValue, failed, ENUM__mathml__list__orderMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_ORDER,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_LIST, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIST,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= list__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= list__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & list__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & list__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}